

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O1

int __thiscall QDirListingPrivate::init(QDirListingPrivate *this,EVP_PKEY_CTX *ctx)

{
  QStringList *this_00;
  QList<QRegularExpression> *this_01;
  _Head_base<0UL,_QAbstractFileEngine_*,_false> _Var1;
  uint uVar2;
  _Head_base<0UL,_QAbstractFileEngine_*,_false> _Var3;
  bool bVar4;
  iterator iVar5;
  iterator iVar6;
  WildcardConversionOptions options;
  CaseSensitivity in_R8D;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QStringView pattern;
  char local_44;
  _Head_base<0UL,_QAbstractFileEngine_*,_false> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->nameFilters;
  str.m_data = (char *)0x1;
  str.m_size = (qsizetype)"*";
  bVar4 = QtPrivate::QStringList_contains((QtPrivate *)this_00,(QStringList *)0x1,str,in_R8D);
  if (bVar4) {
    QList<QString>::clear(this_00);
  }
  if ((this->useLegacyFilters == true) &&
     ((this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
      super_QFlagsStorage<QDir::Filter>.i == -1)) {
    (this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
    super_QFlagsStorage<QDir::Filter>.i = 7;
  }
  this_01 = &this->nameRegExps;
  QList<QRegularExpression>::reserve(this_01,(this->nameFilters).d.size);
  uVar2 = (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
          super_QFlagsStorage<QDirListing::IteratorFlag>.i & 0x100;
  if (this->useLegacyFilters != false) {
    uVar2 = (this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
            super_QFlagsStorage<QDir::Filter>.i & 0x800;
  }
  iVar5 = QList<QString>::begin(this_00);
  iVar6 = QList<QString>::end(this_00);
  if (iVar5.i != iVar6.i) {
    do {
      pattern.m_data = (storage_type_conflict *)((iVar5.i)->d).size;
      pattern.m_size = (qsizetype)&local_40;
      options.super_QFlagsStorageHelper<QRegularExpression::WildcardConversionOption,_4>.
      super_QFlagsStorage<QRegularExpression::WildcardConversionOption>.i._1_3_ = 0;
      options.super_QFlagsStorageHelper<QRegularExpression::WildcardConversionOption,_4>.
      super_QFlagsStorage<QRegularExpression::WildcardConversionOption>.i._0_1_ = uVar2 != 0;
      QRegularExpression::fromWildcard(pattern,(CaseSensitivity)((iVar5.i)->d).ptr,options);
      QtPrivate::QMovableArrayOps<QRegularExpression>::emplace<QRegularExpression>
                ((QMovableArrayOps<QRegularExpression> *)this_01,(this->nameRegExps).d.size,
                 (QRegularExpression *)&local_40);
      QList<QRegularExpression>::end(this_01);
      QRegularExpression::~QRegularExpression((QRegularExpression *)&local_40);
      iVar5.i = iVar5.i + 1;
    } while (iVar5.i != iVar6.i);
  }
  local_44 = (char)ctx;
  if (local_44 != '\0') {
    QFileSystemEngine::createLegacyEngine
              ((QFileSystemEngine *)&local_40,&(this->initialEntryInfo).entry,
               &(this->initialEntryInfo).metaData);
    _Var3._M_head_impl = local_40._M_head_impl;
    local_40._M_head_impl = (QAbstractFileEngine *)0x0;
    _Var1._M_head_impl =
         (this->engine)._M_t.
         super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
         super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
         super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
    (this->engine)._M_t.
    super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
    super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
    super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var1._M_head_impl != (QAbstractFileEngine *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_QAbstractFileEngine + 8))();
    }
    if (local_40._M_head_impl != (QAbstractFileEngine *)0x0) {
      (*(local_40._M_head_impl)->_vptr_QAbstractFileEngine[1])();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QDirListingPrivate::init(bool resolveEngine = true)
{
    if (nameFilters.contains("*"_L1))
        nameFilters.clear();

    if (useLegacyFilters) {
        if (legacyDirFilters == QDir::NoFilter)
            legacyDirFilters = QDir::AllEntries;
    }

#if QT_CONFIG(regularexpression)
    nameRegExps.reserve(nameFilters.size());

    const bool isCase = [this] {
        if (useLegacyFilters)
            return legacyDirFilters.testAnyFlags(QDir::CaseSensitive);
        return iteratorFlags.testAnyFlags(QDirListing::IteratorFlag::CaseSensitive);
    }();

    const auto cs = isCase ? Qt::CaseSensitive : Qt::CaseInsensitive;
    for (const auto &filter : nameFilters)
        nameRegExps.emplace_back(QRegularExpression::fromWildcard(filter, cs));
#endif

    if (resolveEngine) {
        engine = QFileSystemEngine::createLegacyEngine(initialEntryInfo.entry,
                                                       initialEntryInfo.metaData);
    }
}